

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

uint32_t __thiscall leveldb::Random::Next(Random *this)

{
  long lVar1;
  uint *in_RDI;
  long in_FS_OFFSET;
  uint64_t product;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = (int)((ulong)*in_RDI * 0x41a7 >> 0x1f) + ((uint)((ulong)*in_RDI * 0x41a7) & 0x7fffffff);
  if (0x7fffffff < *in_RDI) {
    *in_RDI = *in_RDI + 0x80000001;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t Next() {
    static const uint32_t M = 2147483647L;  // 2^31-1
    static const uint64_t A = 16807;        // bits 14, 8, 7, 5, 2, 1, 0
    // We are computing
    //       seed_ = (seed_ * A) % M,    where M = 2^31-1
    //
    // seed_ must not be zero or M, or else all subsequent computed values
    // will be zero or M respectively.  For all other values, seed_ will end
    // up cycling through every number in [1,M-1]
    uint64_t product = seed_ * A;

    // Compute (product % M) using the fact that ((x << 31) % M) == x.
    seed_ = static_cast<uint32_t>((product >> 31) + (product & M));
    // The first reduction may overflow by 1 bit, so we may need to
    // repeat.  mod == M is not possible; using > allows the faster
    // sign-bit-based test.
    if (seed_ > M) {
      seed_ -= M;
    }
    return seed_;
  }